

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

int Sbl_ManTestSat(Sbl_Man_t *p,int iPivot)

{
  Vec_Int_t *pVVar1;
  Hsh_VecMan_t *p_00;
  lit *plVar2;
  ABC_INT64_T AVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  abctime aVar9;
  Hsh_VecObj_t *pHVar10;
  int *piVar11;
  abctime aVar12;
  abctime aVar13;
  word wVar14;
  word wVar15;
  word wVar16;
  word wVar17;
  abctime time;
  abctime time_00;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  char *pcVar22;
  Vec_Int_t *pVVar23;
  uint uVar24;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar25;
  uint local_70;
  uint local_6c;
  uint local_60;
  
  aVar9 = Abc_Clock();
  iVar18 = p->pHash->vMap->nSize;
  p->nTried = p->nTried + 1;
  Sbl_ManClean(p);
  iVar4 = Sbl_ManWindow2(p,iPivot);
  if (iVar4 == 0) {
    if (p->fVeryVerbose != 0) {
      printf("Obj %d: Window with less than %d nodes does not exist.\n",iPivot,(ulong)(uint)p->nVars
            );
    }
    p->nSmallWins = p->nSmallWins + 1;
  }
  else {
    pVVar1 = p->vAnds;
    p_00 = p->pHash;
    pVVar23 = p_00->vTable;
    iVar4 = pVVar23->nSize;
    if (iVar4 < p_00->vMap->nSize) {
      iVar4 = Abc_PrimeCudd(iVar4 * 2);
      Vec_IntFill(pVVar23,iVar4,-1);
      for (iVar4 = 0; pVVar23 = p_00->vTable, iVar4 < p_00->vMap->nSize; iVar4 = iVar4 + 1) {
        pHVar10 = Hsh_VecObj(p_00,iVar4);
        iVar5 = pHVar10->nSize;
        (p_00->vTemp).nCap = iVar5;
        (p_00->vTemp).nSize = iVar5;
        (p_00->vTemp).pArray = &pHVar10[1].nSize;
        iVar5 = Hsh_VecManHash(&p_00->vTemp,p_00->vTable->nSize);
        piVar11 = Vec_IntEntryP(pVVar23,iVar5);
        iVar5 = *piVar11;
        pHVar10 = Hsh_VecObj(p_00,iVar4);
        pHVar10->iNext = iVar5;
        *piVar11 = iVar4;
      }
      iVar4 = pVVar23->nSize;
    }
    iVar4 = Hsh_VecManHash(pVVar1,iVar4);
    piVar11 = Vec_IntEntryP(pVVar23,iVar4);
    while (pHVar10 = Hsh_VecObj(p_00,*piVar11), pHVar10 != (Hsh_VecObj_t *)0x0) {
      if ((pHVar10->nSize == pVVar1->nSize) &&
         (iVar4 = bcmp(pHVar10 + 1,pVVar1->pArray,(long)pHVar10->nSize << 2), iVar4 == 0))
      goto LAB_00622f53;
      piVar11 = &pHVar10->iNext;
    }
    pVVar23 = p_00->vMap;
    *piVar11 = pVVar23->nSize;
    uVar19 = p_00->vData->nSize;
    if ((uVar19 & 1) != 0) {
      __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                    ,0x216,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
    }
    Vec_IntPush(pVVar23,uVar19);
    Vec_IntPush(p_00->vData,pVVar1->nSize);
    Vec_IntPush(p_00->vData,-1);
    for (iVar4 = 0; iVar4 < pVVar1->nSize; iVar4 = iVar4 + 1) {
      iVar5 = Vec_IntEntry(pVVar1,iVar4);
      Vec_IntPush(p_00->vData,iVar5);
    }
    if ((pVVar1->nSize & 1U) != 0) {
      Vec_IntPush(p_00->vData,-1);
    }
LAB_00622f53:
    if (iVar18 == p->pHash->vMap->nSize) {
      if (p->fVeryVerbose != 0) {
        printf("Obj %d: This window was already tried.\n",(ulong)(uint)iPivot);
      }
      p->nHashWins = p->nHashWins + 1;
    }
    else {
      if (p->fVeryVerbose != 0) {
        printf("\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n",
               (ulong)(uint)iPivot,(ulong)(uint)p->vLeaves->nSize,(ulong)(uint)p->vAnds->nSize);
      }
      uVar19 = p->vLeaves->nSize;
      if (((int)uVar19 < 0x81) && (iVar18 = p->vAnds->nSize, iVar18 <= p->nVars)) {
        if (iVar18 < 10) {
          if (p->fVeryVerbose == 0) {
            return 0;
          }
          puts("Skipping.");
          return 0;
        }
        Sbl_ManComputeCuts(p);
        Sbl_ManCreateCnf(p);
        if (p->fVeryVeryVerbose != 0) {
          uVar6 = sat_solver_nclauses(p->pSat);
          uVar19 = p->vAnds->nSize;
          iVar18 = p->vCutsI1->nSize;
          sat_solver_nclauses(p->pSat);
          printf("All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n"
                 ,(ulong)uVar6,(ulong)uVar19,(ulong)(iVar18 - uVar19));
        }
        pVVar1 = p->vAssump;
        pVVar1->nSize = 0;
        Vec_IntPush(pVVar1,-1);
        iVar4 = 1;
        for (iVar18 = p->vAnds->nSize; iVar18 < p->Power2; iVar18 = iVar18 + 1) {
          pVVar1 = p->vAssump;
          iVar5 = Abc_Var2Lit(iVar18,1);
          Vec_IntPush(pVVar1,iVar5);
        }
        for (iVar18 = 0; iVar18 < p->vRootVars->nSize; iVar18 = iVar18 + 1) {
          iVar5 = Vec_IntEntry(p->vRootVars,iVar18);
          pVVar1 = p->vAssump;
          iVar5 = Abc_Var2Lit(iVar5,0);
          Vec_IntPush(pVVar1,iVar5);
        }
        iVar18 = p->vSolInit->nSize;
        local_70 = 0;
        local_60 = 0;
        do {
          uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
          if ((iVar4 == 0) || (uVar19 = (iVar18 + 1) - iVar4, (int)uVar19 < 1)) goto LAB_00623691;
          if (p->fVeryVerbose != 0) {
            printf("Trying to find mapping with %d LUTs.\n",(ulong)uVar19);
          }
          pVVar1 = p->vAssump;
          iVar5 = Vec_IntEntry(p->vCardVars,uVar19);
          iVar5 = Abc_Var2Lit(iVar5,1);
          Vec_IntWriteEntry(pVVar1,0,iVar5);
          aVar12 = Abc_Clock();
          AVar3 = (p->pSat->stats).conflicts;
          plVar2 = p->vAssump->pArray;
          in_stack_ffffffffffffff88 = 0;
          iVar5 = sat_solver_solve(p->pSat,plVar2,plVar2 + p->vAssump->nSize,(long)p->nBTLimit,0,0,0
                                  );
          aVar13 = Abc_Clock();
          p->timeSat = p->timeSat + (aVar13 - aVar12);
          uVar19 = (int)(p->pSat->stats).conflicts - (int)AVar3;
          local_60 = local_60 + uVar19;
          local_70 = local_70 + 1;
          p->nRuns = p->nRuns + 1;
          if (iVar5 == 1) {
            aVar13 = Abc_Clock();
            p->timeSatSat = p->timeSatSat + (aVar13 - aVar12);
            if (p->fVeryVeryVerbose != 0) {
              for (iVar20 = 0; iVar20 < p->vAnds->nSize; iVar20 = iVar20 + 1) {
                uVar6 = sat_solver_var_value(p->pSat,iVar20);
                printf("%d",(ulong)uVar6);
              }
              putchar(10);
              uVar6 = 0;
              for (uVar24 = 0; (int)uVar24 < p->vAnds->nSize; uVar24 = uVar24 + 1) {
                iVar20 = sat_solver_var_value(p->pSat,uVar24);
                if (iVar20 != 0) {
                  uVar7 = sat_solver_var_value(p->pSat,uVar24);
                  printf("%d=%d ",(ulong)uVar24,(ulong)uVar7);
                  uVar6 = uVar6 + 1;
                }
              }
              printf("Count = %d\n",(ulong)uVar6);
            }
            p->vSolCur->nSize = 0;
            local_6c = 0;
            uVar21 = 1;
            for (iVar20 = p->FirstVar; iVar8 = sat_solver_nvars(p->pSat), iVar20 < iVar8;
                iVar20 = iVar20 + 1) {
              iVar8 = sat_solver_var_value(p->pSat,iVar20);
              if (iVar8 != 0) {
                uVar6 = (uint)uVar21;
                if (p->fVeryVeryVerbose != 0) {
                  uVar6 = uVar6 + 1;
                  uVar24 = Vec_IntEntry(p->vCutsObj,iVar20 - p->FirstVar);
                  pVVar1 = p->vAnds;
                  iVar8 = Vec_IntEntry(p->vCutsObj,iVar20 - p->FirstVar);
                  uVar7 = Vec_IntEntry(pVVar1,iVar8);
                  printf("Cut %3d : Node = %3d %6d  ",uVar21,(ulong)uVar24,(ulong)uVar7);
                  if (p->fVeryVeryVerbose != 0) {
                    iVar8 = iVar20 - p->FirstVar;
                    wVar14 = Vec_WrdEntry(p->vCutsI1,iVar8);
                    wVar15 = Vec_WrdEntry(p->vCutsI2,iVar8);
                    wVar16 = Vec_WrdEntry(p->vCutsN1,iVar8);
                    wVar17 = Vec_WrdEntry(p->vCutsN2,iVar8);
                    printf("{ ");
                    iVar8 = 0;
                    for (uVar21 = 0; uVar21 != 0x40; uVar21 = uVar21 + 1) {
                      if ((wVar14 >> (uVar21 & 0x3f) & 1) != 0) {
                        printf("i%d ",uVar21 & 0xffffffff);
                        iVar8 = iVar8 + 1;
                      }
                    }
                    for (uVar21 = 0; uVar21 != 0x40; uVar21 = uVar21 + 1) {
                      if ((wVar15 >> (uVar21 & 0x3f) & 1) != 0) {
                        printf("i%d ",(ulong)((uint)uVar21 | 0x40));
                        iVar8 = iVar8 + 1;
                      }
                    }
                    putchar(0x20);
                    for (uVar21 = 0; uVar21 != 0x40; uVar21 = uVar21 + 1) {
                      if ((wVar16 >> (uVar21 & 0x3f) & 1) != 0) {
                        printf("n%d ",uVar21 & 0xffffffff);
                        iVar8 = iVar8 + 1;
                      }
                    }
                    for (uVar21 = 0; uVar21 != 0x40; uVar21 = uVar21 + 1) {
                      if ((wVar17 >> (uVar21 & 0x3f) & 1) != 0) {
                        printf("n%d ",(ulong)((uint)uVar21 | 0x40));
                        iVar8 = iVar8 + 1;
                      }
                    }
                    puts("};");
                    local_6c = local_6c + iVar8;
                  }
                }
                Vec_IntPush(p->vSolCur,iVar20 - p->FirstVar);
                uVar21 = (ulong)uVar6;
              }
            }
            if ((p->fDelay == 0) || (iVar20 = Sbl_ManEvaluateMapping(p,p->DelayMax), iVar20 != 0)) {
              pVVar1 = p->vSolBest;
              pVVar1->nSize = 0;
              Vec_IntAppend(pVVar1,p->vSolCur);
              iVar4 = iVar4 + 1;
              pcVar22 = "SAT   ";
              if (p->fVeryVerbose == 0) goto LAB_0062367b;
            }
            else {
              if (p->fVeryVerbose != 0) {
                printf("Critical path of length (%d) is detected:   ",(ulong)(uint)p->vPath->nSize);
                for (uVar6 = 0; (int)uVar6 < p->vPath->nSize; uVar6 = uVar6 + 1) {
                  uVar24 = Vec_IntEntry(p->vPath,uVar6);
                  if ((int)uVar24 < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  uVar24 = Vec_IntEntry(p->vAnds,uVar24 >> 1);
                  printf("%d=%d ",(ulong)uVar6,(ulong)uVar24);
                }
                putchar(10);
              }
              plVar2 = p->vPath->pArray;
              iVar20 = sat_solver_addclause(p->pSat,plVar2,plVar2 + p->vPath->nSize);
              if (iVar20 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                              ,0x452,"int Sbl_ManTestSat(Sbl_Man_t *, int)");
              }
LAB_006235c9:
              if (p->fVeryVerbose == 0) goto LAB_0062367b;
              pcVar22 = "UNDEC ";
              if (iVar5 == 1) {
                pcVar22 = "SAT   ";
              }
              if (iVar5 == -1) {
                pcVar22 = "UNSAT ";
              }
            }
LAB_006235f7:
            printf(pcVar22);
            pcVar22 = (char *)(ulong)uVar19;
            printf("confl =%8d.    ");
            aVar13 = Abc_Clock();
            Abc_PrintTime((int)aVar13 - (int)aVar12,pcVar22,time);
            printf("Total ");
            pcVar22 = (char *)(ulong)local_60;
            printf("confl =%8d.    ");
            aVar12 = Abc_Clock();
            Abc_PrintTime((int)aVar12 - (int)aVar9,pcVar22,time_00);
            if ((iVar5 == 1) && (p->fVeryVeryVerbose != 0)) {
              printf("LitCount = %d.\n",(ulong)local_6c);
            }
            putchar(10);
          }
          else {
            aVar13 = Abc_Clock();
            uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
            if (iVar5 != -1) {
              p->timeSatUnd = p->timeSatUnd + (aVar13 - aVar12);
              local_6c = 0;
              iVar4 = 0;
              if (iVar5 != 0) goto LAB_006235c9;
              goto LAB_00623691;
            }
            p->timeSatUns = p->timeSatUns + (aVar13 - aVar12);
            local_6c = 0;
            pcVar22 = "UNSAT ";
            iVar4 = 0;
            if (p->fVeryVerbose != 0) goto LAB_006235f7;
          }
LAB_0062367b:
          uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
        } while (local_70 != 10);
        p->nIterOuts = p->nIterOuts + 1;
        local_70 = 10;
LAB_00623691:
        iVar18 = p->vSolBest->nSize;
        if ((0 < iVar18) && (iVar18 < p->vSolInit->nSize)) {
          Sbl_ManUpdateMapping(p);
          if (p->pGia->vEdge1 == (Vec_Int_t *)0x0) {
            uVar19 = Sbl_ManCreateTiming(p,p->DelayMax);
            iVar18 = 0;
          }
          else {
            uVar19 = Gia_ManEvalEdgeDelay(p->pGia);
            iVar18 = Gia_ManEvalEdgeCount(p->pGia);
          }
          if (p->fVerbose != 0) {
            printf("Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n"
                   ,(ulong)(uint)iPivot,(ulong)(uint)(p->vSolInit->nSize - p->vSolBest->nSize),
                   (ulong)local_60,(ulong)local_70,(ulong)uVar19,CONCAT44(uVar25,iVar18));
          }
          aVar9 = Abc_Clock();
          p->timeTotal = p->timeTotal + (aVar9 - p->timeStart);
          p->nImproved = p->nImproved + 1;
          return 2;
        }
        aVar9 = Abc_Clock();
        p->timeTotal = p->timeTotal + (aVar9 - p->timeStart);
        return 1;
      }
      if (p->fVeryVerbose != 0) {
        printf("Obj %d: Encountered window with %d inputs and %d internal nodes.\n",
               (ulong)(uint)iPivot,(ulong)uVar19,(ulong)(uint)p->vAnds->nSize);
      }
      p->nLargeWins = p->nLargeWins + 1;
    }
  }
  return 0;
}

Assistant:

int Sbl_ManTestSat( Sbl_Man_t * p, int iPivot )
{
    int fKeepTrying = 1;
    abctime clk = Abc_Clock(), clk2;
    int i, status, Root, Count, StartSol, nConfTotal = 0, nIters = 0;
    int nEntries = Hsh_VecSize( p->pHash );
    p->nTried++;

    Sbl_ManClean( p );

    // compute one window
    Count = Sbl_ManWindow2( p, iPivot );
    if ( Count == 0 )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Window with less than %d nodes does not exist.\n", iPivot, p->nVars );
        p->nSmallWins++;
        return 0;
    }
    Hsh_VecManAdd( p->pHash, p->vAnds );
    if ( nEntries == Hsh_VecSize(p->pHash) )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: This window was already tried.\n", iPivot );
        p->nHashWins++;
        return 0;
    }
    if ( p->fVeryVerbose )
    printf( "\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n", 
        iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds), Vec_IntSize(p->vRoots), Vec_IntSize(p->vNodes) ); 

    if ( Vec_IntSize(p->vLeaves) > 128 || Vec_IntSize(p->vAnds) > p->nVars )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Encountered window with %d inputs and %d internal nodes.\n", iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds) );
        p->nLargeWins++;
        return 0;
    }
    if ( Vec_IntSize(p->vAnds) < 10 )
    {
        if ( p->fVeryVerbose )
        printf( "Skipping.\n" );
        return 0;
    }

    // derive cuts
    Sbl_ManComputeCuts( p );
    // derive SAT instance
    Sbl_ManCreateCnf( p );

    if ( p->fVeryVeryVerbose )
    printf( "All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n", 
        sat_solver_nclauses(p->pSat), Vec_IntSize(p->vAnds), Vec_WrdSize(p->vCutsI1) - Vec_IntSize(p->vAnds), 
        sat_solver_nclauses(p->pSat) - Vec_WrdSize(p->vCutsI1) );

    // create assumptions
    // cardinality
    Vec_IntClear( p->vAssump );
    Vec_IntPush( p->vAssump, -1 );
    // unused variables
    for ( i = Vec_IntSize(p->vAnds); i < p->Power2; i++ )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(i, 1) );
    // root variables
    Vec_IntForEachEntry( p->vRootVars, Root, i )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(Root, 0) );
//    Vec_IntPrint( p->vAssump );

    StartSol = Vec_IntSize(p->vSolInit) + 1;
//    StartSol = 30;
    while ( fKeepTrying && StartSol-fKeepTrying > 0 )
    {
        int Count = 0, LitCount = 0;
        int nConfBef, nConfAft;
        if ( p->fVeryVerbose )
            printf( "Trying to find mapping with %d LUTs.\n", StartSol-fKeepTrying );
    //    for ( i = Vec_IntSize(p->vSolInit)-5; i < nVars; i++ )
    //        Vec_IntPush( p->vAssump, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, i), 1) );
        Vec_IntWriteEntry( p->vAssump, 0, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, StartSol-fKeepTrying), 1) );
        // solve the problem
        clk2 = Abc_Clock();
        nConfBef = (int)p->pSat->stats.conflicts;
        status = sat_solver_solve( p->pSat, Vec_IntArray(p->vAssump), Vec_IntLimit(p->vAssump), p->nBTLimit, 0, 0, 0 );
        p->timeSat += Abc_Clock() - clk2;
        nConfAft = (int)p->pSat->stats.conflicts;
        nConfTotal += nConfAft - nConfBef;
        nIters++;
        p->nRuns++;
        if ( status == l_True )
            p->timeSatSat += Abc_Clock() - clk2;
        else if ( status == l_False )
            p->timeSatUns += Abc_Clock() - clk2;
        else 
            p->timeSatUnd += Abc_Clock() - clk2;
        if ( status == l_Undef )
            break;
        if ( status == l_True )
        {
            if ( p->fVeryVeryVerbose )
            {
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    printf( "%d", sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    if ( sat_solver_var_value(p->pSat, i) )
                    {
                        printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                        Count++;
                    }
                printf( "Count = %d\n", Count );
            }
//            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
//                printf( "%d", sat_solver_var_value(p->pSat, i) );
//            printf( "\n" );
            Count = 1;
            Vec_IntClear( p->vSolCur );
            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
                if ( sat_solver_var_value(p->pSat, i) )
                {
                    if ( p->fVeryVeryVerbose )
                        printf( "Cut %3d : Node = %3d %6d  ", Count++, Vec_IntEntry(p->vCutsObj, i-p->FirstVar), Vec_IntEntry(p->vAnds, Vec_IntEntry(p->vCutsObj, i-p->FirstVar)) );
                    if ( p->fVeryVeryVerbose )
                        LitCount += Sbl_ManFindAndPrintCut( p, i-p->FirstVar );
                    Vec_IntPush( p->vSolCur, i-p->FirstVar );
                }
            //Vec_IntPrint( p->vRootVars );
            //Vec_IntPrint( p->vRoots );
            //Vec_IntPrint( p->vAnds );
            //Vec_IntPrint( p->vLeaves );
        }

//        fKeepTrying = status == l_True ? fKeepTrying + 1 : 0;
        // check the timing
        if ( status == l_True )
        {
            if ( p->fDelay && !Sbl_ManEvaluateMapping(p, p->DelayMax) )
            {
                int iLit, value;
                if ( p->fVeryVerbose )
                {
                    printf( "Critical path of length (%d) is detected:   ", Vec_IntSize(p->vPath) );
                    Vec_IntForEachEntry( p->vPath, iLit, i )
                        printf( "%d=%d ", i, Vec_IntEntry(p->vAnds, Abc_Lit2Var(iLit)) );
                    printf( "\n" );
                }
                // add the clause
                value = sat_solver_addclause( p->pSat, Vec_IntArray(p->vPath), Vec_IntLimit(p->vPath)  );
                assert( value );
            }
            else
            {
                Vec_IntClear( p->vSolBest );
                Vec_IntAppend( p->vSolBest, p->vSolCur );
                fKeepTrying++;
            }
        }
        else
            fKeepTrying = 0;
        if ( p->fVeryVerbose )
        {
            if ( status == l_False )
                printf( "UNSAT " );
            else if ( status == l_True )
                printf( "SAT   " );
            else 
                printf( "UNDEC " );
            printf( "confl =%8d.    ", nConfAft - nConfBef );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );

            printf( "Total " );
            printf( "confl =%8d.    ", nConfTotal );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            if ( p->fVeryVeryVerbose && status == l_True )
                printf( "LitCount = %d.\n", LitCount );
            printf( "\n" );
        }
        if ( nIters == 10 )
        {
            p->nIterOuts++;
            //printf( "Obj %d : Quitting after %d iterations.\n", iPivot, nIters );
            break;
        }
    }

    // update solution
    if ( Vec_IntSize(p->vSolBest) > 0 && Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit) )
    {
        int nDelayCur, nEdgesCur = 0;
        Sbl_ManUpdateMapping( p );
        if ( p->pGia->vEdge1 )
        {
            nDelayCur = Gia_ManEvalEdgeDelay( p->pGia );
            nEdgesCur = Gia_ManEvalEdgeCount( p->pGia );
        }
        else
            nDelayCur = Sbl_ManCreateTiming( p, p->DelayMax );
        if ( p->fVerbose )
        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n", 
            iPivot, Vec_IntSize(p->vSolInit)-Vec_IntSize(p->vSolBest), nConfTotal, nIters, nDelayCur, nEdgesCur );
        p->timeTotal += Abc_Clock() - p->timeStart;
        p->nImproved++;
        return 2;
    }
    else
    {
//        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d\n", iPivot, 0, nConfTotal, nIters );
    }
    p->timeTotal += Abc_Clock() - p->timeStart;
    return 1;
}